

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

void __thiscall Js::JavascriptLibraryBase::Dispose(JavascriptLibraryBase *this,bool isShutdown)

{
  ScriptContext **ppSVar1;
  nullptr_t local_28;
  WriteBarrierPtr<Js::ScriptContext> local_20;
  undefined1 local_11;
  JavascriptLibraryBase *pJStack_10;
  bool isShutdown_local;
  JavascriptLibraryBase *this_local;
  
  local_11 = isShutdown;
  pJStack_10 = this;
  ppSVar1 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                      ((WriteBarrierPtr *)&this->scriptContext);
  if (*ppSVar1 != (ScriptContext *)0x0) {
    Memory::WriteBarrierPtr<Js::ScriptContext>::WriteBarrierPtr(&local_20,&this->scriptContext);
    Memory::DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Js::ScriptContext>
              (&Memory::HeapAllocator::Instance,&local_20);
    local_28 = (nullptr_t)0x0;
    Memory::WriteBarrierPtr<Js::ScriptContext>::operator=(&this->scriptContext,&local_28);
  }
  return;
}

Assistant:

void JavascriptLibraryBase::Dispose(bool isShutdown)
    {
        if (scriptContext)
        {
            HeapDelete(scriptContext);
            scriptContext = nullptr;
        }
    }